

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void google::protobuf::internal::DefaultLogHandler
               (LogLevel level,char *filename,int line,string *message)

{
  char *pcVar1;
  FILE *__stream;
  undefined8 uVar2;
  string *message_local;
  int line_local;
  char *filename_local;
  LogLevel level_local;
  
  __stream = _stderr;
  if (-1 < (int)level) {
    pcVar1 = DefaultLogHandler::level_names[level];
    uVar2 = std::__cxx11::string::c_str();
    fprintf(__stream,"[libprotobuf %s %s:%d] %s\n",pcVar1,filename,(ulong)(uint)line,uVar2);
    fflush(_stderr);
  }
  return;
}

Assistant:

void DefaultLogHandler(LogLevel level, const char* filename, int line,
                       const string& message) {
  if (level < GOOGLE_PROTOBUF_MIN_LOG_LEVEL) {
    return;
  }
  static const char* level_names[] = { "INFO", "WARNING", "ERROR", "FATAL" };

  // We use fprintf() instead of cerr because we want this to work at static
  // initialization time.
  fprintf(stderr, "[libprotobuf %s %s:%d] %s\n",
          level_names[level], filename, line, message.c_str());
  fflush(stderr);  // Needed on MSVC.
}